

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qelfparser_p.cpp
# Opt level: O3

QLibraryScanResult __thiscall
QElfParser::parse(QElfParser *this,QByteArrayView data,QString *errMsg)

{
  Elf64_Half *pEVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  Elf64_Half *pEVar5;
  ulong uVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long in_FS_OFFSET;
  QLibraryScanResult QVar11;
  QByteArrayView data_00;
  ErrorMaker local_78;
  QString local_70;
  QString local_58;
  QString local_40;
  long local_28;
  
  local_78.errMsg = (QString *)data.m_data;
  data_00.m_data = (Ehdr *)data.m_size;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this < (QElfParser *)0x40) {
    QMetaObject::tr(&local_40,&QLibrary::staticMetaObject,"file too small",(char *)0x0,-1);
    anon_unknown.dwarf_187bda4::ErrorMaker::operator()(&local_78,&local_40);
    parse((QElfParser *)&local_40);
  }
  else if (((((*(int *)(data_00.m_data)->e_ident == 0x464c457f) &&
             ((data_00.m_data)->e_ident[4] == '\x02')) && ((data_00.m_data)->e_ident[5] == '\x01'))
           && (((data_00.m_data)->e_ident[6] == '\x01' && ((data_00.m_data)->e_type == 3)))) &&
          (((data_00.m_data)->e_machine == 0x3e && ((data_00.m_data)->e_version == 1)))) {
    if ((data_00.m_data)->e_phentsize == 0x38) {
      uVar8 = (ulong)(data_00.m_data)->e_phnum;
      if (uVar8 == 0xffff) {
        QMetaObject::tr(&local_40,&QLibrary::staticMetaObject,
                        "unimplemented: PN_XNUM program headers",(char *)0x0,-1);
        anon_unknown.dwarf_187bda4::ErrorMaker::operator()(&local_78,&local_40);
        parse((QElfParser *)&local_40);
      }
      else {
        uVar6 = uVar8 * 0x38;
        uVar9 = (data_00.m_data)->e_phoff;
        if ((CARRY8(uVar6,uVar9)) || (this < (QElfParser *)(uVar6 + uVar9))) {
          QMetaObject::tr(&local_40,&QLibrary::staticMetaObject,
                          "program header table extends past the end of the file",(char *)0x0,-1);
          anon_unknown.dwarf_187bda4::ErrorMaker::operator()(&local_78,&local_40);
          parse((QElfParser *)&local_40);
        }
        else {
          if (uVar8 != 0) {
            pEVar5 = (Elf64_Half *)((data_00.m_data)->e_ident + uVar9);
            pEVar1 = pEVar5 + uVar8 * 0x1c;
            lVar10 = 0;
            bVar7 = 0;
            do {
              uVar8 = *(ulong *)((data_00.m_data)->e_ident + lVar10 + uVar9 + 8);
              uVar4 = *(ulong *)((data_00.m_data)->e_ident + lVar10 + uVar9 + 0x20);
              if ((CARRY8(uVar8,uVar4)) || (this < (QElfParser *)(uVar8 + uVar4))) {
                QMetaObject::tr(&local_40,&QLibrary::staticMetaObject,
                                "a program header entry extends past the end of the file",
                                (char *)0x0,-1);
                anon_unknown.dwarf_187bda4::ErrorMaker::operator()(&local_78,&local_40);
                parse((QElfParser *)&local_40);
                goto LAB_00496484;
              }
              if (*(int *)((data_00.m_data)->e_ident + lVar10 + uVar9) == 4) {
                uVar4 = *(ulong *)((data_00.m_data)->e_ident + lVar10 + uVar9 + 0x30) - 1;
                if ((uVar4 < (*(ulong *)((data_00.m_data)->e_ident + lVar10 + uVar9 + 0x30) ^ uVar4)
                    ) && ((uVar4 & uVar8) != 0)) {
                  QMetaObject::tr(&local_70,&QLibrary::staticMetaObject,
                                  "a note segment start is not properly aligned (offset 0x%1, alignment %2)"
                                  ,(char *)0x0,-1);
                  QString::arg_impl(&local_58,&local_70,
                                    *(qulonglong *)((data_00.m_data)->e_ident + lVar10 + 8 + uVar9),
                                    6,0x10,(QChar)0x30);
                  QString::arg_impl(&local_40,&local_58,
                                    *(qulonglong *)
                                     ((data_00.m_data)->e_ident + lVar10 + 0x30 + uVar9),0,10,
                                    (QChar)0x20);
                  anon_unknown.dwarf_187bda4::ErrorMaker::operator()(&local_78,&local_40);
                  parse();
                  goto LAB_00496484;
                }
              }
              else if ((*(int *)((data_00.m_data)->e_ident + lVar10 + uVar9) == 1) && (uVar4 != 0))
              {
                bVar7 = bVar7 | (data_00.m_data)->e_ident[lVar10 + uVar9 + 4];
              }
              lVar10 = lVar10 + 0x38;
            } while (uVar6 - lVar10 != 0);
            if ((bVar7 & 1) != 0) {
              do {
                if ((((*(int *)pEVar5 == 4) && (*(long *)(pEVar5 + 0x18) == 8)) &&
                    (uVar8 = *(ulong *)(pEVar5 + 0x10), -1 < (long)uVar8)) && (0x21 < uVar8)) {
                  uVar8 = uVar8 + *(ulong *)(pEVar5 + 4);
                  uVar9 = *(ulong *)(pEVar5 + 4);
                  do {
                    uVar2 = *(uint *)((data_00.m_data)->e_ident + uVar9);
                    if (CARRY8(uVar9 + 0x11,(ulong)uVar2)) break;
                    uVar3 = *(uint *)((data_00.m_data)->e_ident + uVar9 + 4);
                    uVar6 = uVar9 + 0x11 + (ulong)uVar2 & 0xfffffffffffffff8 | 5;
                    if (CARRY8(uVar6,(ulong)uVar3)) break;
                    uVar6 = uVar6 + uVar3 & 0xfffffffffffffff8;
                    if (uVar8 < uVar6) break;
                    if (((uVar2 == 0xc) && (5 < uVar3)) &&
                       ((*(int *)((data_00.m_data)->e_ident + uVar9 + 8) == 0x74510001 &&
                        (*(int *)((data_00.m_data)->e_ident + uVar9 + 0x14) == 0x217463 &&
                         *(long *)((data_00.m_data)->e_ident + uVar9 + 0xc) == 0x656a6f72702d7471)))
                       ) {
                      QVar11.length._0_4_ = uVar3;
                      QVar11.pos = uVar9 + 0x18;
                      QVar11.length._4_4_ = 0;
                      goto LAB_00496488;
                    }
                    uVar9 = uVar6;
                  } while (0x21 < (long)(uVar8 - uVar6));
                }
                pEVar5 = pEVar5 + 0x1c;
              } while (pEVar5 != pEVar1);
              if ((data_00.m_data)->e_shentsize == 0x40) {
                if (((data_00.m_data)->e_shoff == 0) || ((data_00.m_data)->e_shnum == 0)) {
                  anon_unknown.dwarf_187bda4::ErrorMaker::notfound(&local_78);
                }
                else {
                  if ((data_00.m_data)->e_shstrndx < (data_00.m_data)->e_shnum) {
                    data_00.m_size = (qsizetype)this;
                    QVar11 = ::scanSections(data_00,&local_78);
                    goto LAB_00496488;
                  }
                  QMetaObject::tr(&local_70,&QLibrary::staticMetaObject,
                                  "e_shstrndx greater than the number of sections e_shnum (%1 >= %2)"
                                  ,(char *)0x0,-1);
                  QString::arg_impl(&local_58,&local_70,(ulong)(data_00.m_data)->e_shstrndx,0,10,
                                    (QChar)0x20);
                  QString::arg_impl(&local_40,&local_58,(ulong)(data_00.m_data)->e_shnum,0,10,
                                    (QChar)0x20);
                  anon_unknown.dwarf_187bda4::ErrorMaker::operator()(&local_78,&local_40);
                  parse();
                }
              }
              else {
                QMetaObject::tr(&local_58,&QLibrary::staticMetaObject,
                                "unexpected section entry size (%1)",(char *)0x0,-1);
                QString::arg_impl(&local_40,&local_58,(ulong)(data_00.m_data)->e_shentsize,0,10,
                                  (QChar)0x20);
                anon_unknown.dwarf_187bda4::ErrorMaker::operator()(&local_78,&local_40);
                parse();
              }
              goto LAB_00496484;
            }
          }
          QMetaObject::tr(&local_40,&QLibrary::staticMetaObject,"file has no code",(char *)0x0,-1);
          anon_unknown.dwarf_187bda4::ErrorMaker::notplugin(&local_78,&local_40);
          parse((QElfParser *)&local_40);
        }
      }
    }
    else {
      QMetaObject::tr(&local_58,&QLibrary::staticMetaObject,
                      "unexpected program header entry size (%1)",(char *)0x0,-1);
      QString::arg_impl(&local_40,&local_58,(ulong)(data_00.m_data)->e_phentsize,0,10,(QChar)0x20);
      anon_unknown.dwarf_187bda4::ErrorMaker::operator()(&local_78,&local_40);
      parse();
    }
  }
  else {
    anon_unknown.dwarf_187bda4::ElfHeaderCheck<unsigned_long_long,_(QSysInfo::Endian)1>::
    explainCheckFailure(&local_40,data_00.m_data);
    anon_unknown.dwarf_187bda4::ErrorMaker::operator()(&local_78,&local_40);
    parse((QElfParser *)&local_40);
  }
LAB_00496484:
  QVar11 = (QLibraryScanResult)ZEXT816(0);
LAB_00496488:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return QVar11;
}

Assistant:

QLibraryScanResult QElfParser::parse(QByteArrayView data, QString *errMsg)
{
    ErrorMaker error(errMsg);
    if (size_t(data.size()) < sizeof(T::Ehdr)) {
        qEDebug << "file too small:" << size_t(data.size());
        return error(QLibrary::tr("file too small"));
    }

    qEDebug << ElfHeaderDebug{ reinterpret_cast<const uchar *>(data.data()) };

    auto header = reinterpret_cast<const T::Ehdr *>(data.data());
    if (!ElfHeaderCheck<>::checkHeader(*header))
        return error(ElfHeaderCheck<>::explainCheckFailure(*header));

    qEDebug << "contains" << header->e_phnum << "program headers of"
            << header->e_phentsize << "bytes at offset" << header->e_phoff;
    qEDebug << "contains" << header->e_shnum << "sections of" << header->e_shentsize
            << "bytes at offset" << header->e_shoff
            << "; section header string table (shstrtab) is entry" << header->e_shstrndx;

    // some sanity checks
    if constexpr (IncludeValidityChecks) {
        if (header->e_phentsize != sizeof(T::Phdr))
            return error(QLibrary::tr("unexpected program header entry size (%1)")
                         .arg(header->e_phentsize));
    }

    if (!preScanProgramHeaders(data, error))
        return {};

    if (QLibraryScanResult r = scanProgramHeadersForNotes(data, error); r.length)
        return r;

    if (!ElfNotesAreMandatory) {
        if constexpr (IncludeValidityChecks) {
            if (header->e_shentsize != sizeof(T::Shdr))
                return error(QLibrary::tr("unexpected section entry size (%1)")
                             .arg(header->e_shentsize));
        }
        if (header->e_shoff == 0 || header->e_shnum == 0) {
            // this is still a valid ELF file but we don't have a section table
            qEDebug << "no section table present, not able to find Qt metadata";
            return error.notfound();
        }

        if (header->e_shnum && header->e_shstrndx >= header->e_shnum)
            return error(QLibrary::tr("e_shstrndx greater than the number of sections e_shnum (%1 >= %2)")
                         .arg(header->e_shstrndx).arg(header->e_shnum));
        return scanSections(data, error);
    }
    return error.notfound();
}